

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegisterAllocation.cpp
# Opt level: O0

void addFirstLineAllocation(AssemblyCommands *commands,RegisterInfo *registerInfo)

{
  RegisterInfo *this;
  undefined1 local_b8 [32];
  __normal_iterator<std::shared_ptr<AssemblyCode::AssemblyCommand>_*,_std::vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>_>
  local_98;
  const_iterator local_90;
  shared_ptr<AssemblyCode::AssemblyCommand> *local_88;
  int local_6c;
  CTemp local_68;
  undefined1 local_48 [32];
  __normal_iterator<std::shared_ptr<AssemblyCode::AssemblyCommand>_*,_std::vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>_>
  local_28;
  const_iterator local_20;
  RegisterInfo *local_18;
  RegisterInfo *registerInfo_local;
  AssemblyCommands *commands_local;
  
  local_18 = registerInfo;
  registerInfo_local = (RegisterInfo *)commands;
  local_28._M_current =
       (shared_ptr<AssemblyCode::AssemblyCommand> *)
       std::
       vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
       ::begin(commands);
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<AssemblyCode::AssemblyCommand>const*,std::vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>>
  ::__normal_iterator<std::shared_ptr<AssemblyCode::AssemblyCommand>*>
            ((__normal_iterator<std::shared_ptr<AssemblyCode::AssemblyCommand>const*,std::vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>>
              *)&local_20,&local_28);
  IRT::CTemp::CTemp(&local_68,&local_18->espReg);
  local_6c = totalAllocated * 4;
  std::make_shared<AssemblyCode::SubRegConstCommand,IRT::CTemp,int>
            ((CTemp *)local_48,(int *)&local_68);
  std::shared_ptr<AssemblyCode::AssemblyCommand>::shared_ptr<AssemblyCode::SubRegConstCommand,void>
            ((shared_ptr<AssemblyCode::AssemblyCommand> *)(local_48 + 0x10),
             (shared_ptr<AssemblyCode::SubRegConstCommand> *)local_48);
  local_88 = (shared_ptr<AssemblyCode::AssemblyCommand> *)
             std::
             vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
             ::insert(commands,local_20,
                      (shared_ptr<AssemblyCode::AssemblyCommand> *)(local_48 + 0x10));
  std::shared_ptr<AssemblyCode::AssemblyCommand>::~shared_ptr
            ((shared_ptr<AssemblyCode::AssemblyCommand> *)(local_48 + 0x10));
  std::shared_ptr<AssemblyCode::SubRegConstCommand>::~shared_ptr
            ((shared_ptr<AssemblyCode::SubRegConstCommand> *)local_48);
  IRT::CTemp::~CTemp(&local_68);
  this = registerInfo_local;
  local_98._M_current =
       (shared_ptr<AssemblyCode::AssemblyCommand> *)
       std::
       vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
       ::begin((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
                *)registerInfo_local);
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<AssemblyCode::AssemblyCommand>const*,std::vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>>
  ::__normal_iterator<std::shared_ptr<AssemblyCode::AssemblyCommand>*>
            ((__normal_iterator<std::shared_ptr<AssemblyCode::AssemblyCommand>const*,std::vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>>
              *)&local_90,&local_98);
  std::make_shared<AssemblyCode::MoveRegRegCommand,IRT::CTemp&,IRT::CTemp&>
            ((CTemp *)local_b8,&local_18->spBeginReg);
  std::shared_ptr<AssemblyCode::AssemblyCommand>::shared_ptr<AssemblyCode::MoveRegRegCommand,void>
            ((shared_ptr<AssemblyCode::AssemblyCommand> *)(local_b8 + 0x10),
             (shared_ptr<AssemblyCode::MoveRegRegCommand> *)local_b8);
  std::
  vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
  ::insert((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
            *)this,local_90,(shared_ptr<AssemblyCode::AssemblyCommand> *)(local_b8 + 0x10));
  std::shared_ptr<AssemblyCode::AssemblyCommand>::~shared_ptr
            ((shared_ptr<AssemblyCode::AssemblyCommand> *)(local_b8 + 0x10));
  std::shared_ptr<AssemblyCode::MoveRegRegCommand>::~shared_ptr
            ((shared_ptr<AssemblyCode::MoveRegRegCommand> *)local_b8);
  return;
}

Assistant:

void addFirstLineAllocation(AssemblyCommands& commands, AssemblyCode::RegisterInfo& registerInfo) {
    commands.insert(commands.begin(),
                    std::make_shared<AssemblyCode::SubRegConstCommand>(IRT::CTemp(registerInfo.espReg),
                    totalAllocated * IRT::CFrame::wordSize));

    commands.insert(commands.begin(),
                    std::make_shared<AssemblyCode::MoveRegRegCommand>(registerInfo.spBeginReg,
                                                    registerInfo.espReg));
}